

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osQueue.cpp
# Opt level: O0

void * __thiscall osQueue::Peek(osQueue *this)

{
  void *local_18;
  void *rc;
  osQueue *this_local;
  
  osMutex::Take(&this->Lock,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osQueue.cpp"
                ,0x48);
  if (this->ElementCount == 0) {
    local_18 = (void *)0x0;
  }
  else {
    local_18 = this->Array[this->NextOutIndex];
  }
  osMutex::Give(&this->Lock);
  return local_18;
}

Assistant:

void* osQueue::Peek()
{
    void* rc;

    Lock.Take(__FILE__, __LINE__);

    if (ElementCount != 0)
    {
        rc = Array[NextOutIndex];
    }
    else
    {
        rc = nullptr;
    }

    Lock.Give();
    return rc;
}